

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O1

char * google::protobuf::internal::TcParser::MpVarint<false>
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  byte bVar1;
  ushort uVar2;
  uint32_t *data_00;
  byte *pbVar3;
  bool bVar4;
  int iVar5;
  char *pcVar6;
  TailCallParseFunc UNRECOVERED_JUMPTABLE;
  string *psVar7;
  uint uVar8;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aVar9;
  ParseContext *pPVar10;
  ushort *puVar11;
  uint uVar12;
  ulong *puVar13;
  undefined4 *puVar14;
  uint value;
  ulong uVar15;
  uint uVar16;
  FieldEntry *entry;
  uint *puVar17;
  LogMessageFatal local_40 [16];
  
  entry = (FieldEntry *)((long)&table->has_bits_offset + ((ulong)data.field_0 >> 0x20));
  if (((ulong)entry & 3) != 0) {
    AlignFail(entry);
  }
  uVar2 = entry->type_card;
  uVar16 = uVar2 & 0x30;
  if (uVar16 == 0x20) {
    pcVar6 = MpRepeatedVarint<false>(msg,ptr,ctx,data,table,hasbits);
    return pcVar6;
  }
  if (((ulong)data.field_0 & 7) != 0) {
    UNRECOVERED_JUMPTABLE = table->fallback;
    puVar11 = (ushort *)ptr;
    goto LAB_001582ad;
  }
  uVar15 = (ulong)*ptr;
  pPVar10 = ctx;
  if ((long)uVar15 < 0) {
    pcVar6 = (char *)0xffffffffffffff80;
    aVar9.data = (long)ptr[1] << 7 | 0x7f;
    if ((long)aVar9 < 0) {
      pPVar10 = (ParseContext *)((long)ptr[2] << 0xe | 0x3fff);
      if ((long)pPVar10 < 0) {
        aVar9.data = aVar9.data & ((long)ptr[3] << 0x15 | 0x1fffffU);
        if ((long)aVar9 < 0) {
          pPVar10 = (ParseContext *)((ulong)pPVar10 & ((long)ptr[4] << 0x1c | 0xfffffffU));
          if ((long)pPVar10 < 0) {
            aVar9.data = aVar9.data & ((long)ptr[5] << 0x23 | 0x7ffffffffU);
            if ((long)aVar9 < 0) {
              pPVar10 = (ParseContext *)((ulong)pPVar10 & ((long)ptr[6] << 0x2a | 0x3ffffffffffU));
              if ((long)pPVar10 < 0) {
                aVar9.data = aVar9.data & ((long)ptr[7] << 0x31 | 0x1ffffffffffffU);
                if ((long)aVar9 < 0) {
                  pPVar10 = (ParseContext *)
                            ((ulong)pPVar10 & ((ulong)(byte)ptr[8] << 0x38 | 0xffffffffffffff));
                  if ((long)pPVar10 < 0) {
                    puVar11 = (ushort *)(ptr + 10);
                    if (ptr[9] != '\x01') {
                      bVar1 = ptr[9];
                      pcVar6 = (char *)CONCAT71(0xffffffffffffff,bVar1);
                      if ((char)bVar1 < '\0') {
                        puVar11 = (ushort *)0x0;
                        goto LAB_001582d1;
                      }
                      if ((bVar1 & 1) == 0) {
                        pPVar10 = (ParseContext *)((ulong)pPVar10 ^ 0x8000000000000000);
                      }
                    }
                  }
                  else {
                    puVar11 = (ushort *)(ptr + 9);
                  }
                }
                else {
                  puVar11 = (ushort *)(ptr + 8);
                }
              }
              else {
                puVar11 = (ushort *)(ptr + 7);
              }
            }
            else {
              puVar11 = (ushort *)(ptr + 6);
            }
          }
          else {
            puVar11 = (ushort *)(ptr + 5);
          }
        }
        else {
          puVar11 = (ushort *)(ptr + 4);
        }
      }
      else {
        puVar11 = (ushort *)(ptr + 3);
      }
      aVar9.data = aVar9.data & (ulong)pPVar10;
    }
    else {
      puVar11 = (ushort *)(ptr + 2);
    }
    uVar15 = uVar15 & aVar9.data;
  }
  else {
    puVar11 = (ushort *)(ptr + 1);
    aVar9 = data.field_0;
    pcVar6 = ptr;
  }
LAB_001582d1:
  if (puVar11 == (ushort *)0x0) {
    pcVar6 = Error(msg,pcVar6,pPVar10,(TcFieldData)aVar9,table,hasbits);
    return pcVar6;
  }
  uVar8 = uVar2 & 0x600;
  pPVar10 = (ParseContext *)(ulong)uVar8;
  uVar12 = uVar2 & 0x1c0;
  value = (uint)uVar15;
  if ((ulong)uVar12 == 0xc0) {
    if (uVar8 == 0x200) {
      uVar15 = -(ulong)(value & 1) ^ uVar15 >> 1;
    }
  }
  else if (uVar12 == 0x80) {
    if ((uVar2 >> 10 & 1) == 0) {
      if (uVar8 == 0x200) {
        uVar15 = (ulong)(int)(-(value & 1) ^ (uint)(uVar15 >> 1) & 0x7fffffff);
      }
    }
    else {
      data_00 = *(uint32_t **)
                 ((long)&table->has_bits_offset +
                 (ulong)entry->aux_idx * 8 + (ulong)table->aux_offset);
      if (uVar8 == 0x600) {
        iVar5 = (int)(short)data_00;
        pPVar10 = (ParseContext *)(ulong)CONCAT31(6,iVar5 <= (int)value);
        bVar4 = (int)value < (int)(((uint)((ulong)data_00 >> 0x10) & 0xffff) + iVar5) &&
                iVar5 <= (int)value;
      }
      else {
        bVar4 = ValidateEnum(value,data_00);
      }
      if (bVar4 == false) {
        pcVar6 = MpUnknownEnumFallback(msg,ptr,ctx,data,table,hasbits);
        return pcVar6;
      }
    }
  }
  if (uVar16 == 0x30) {
    ChangeOneof(table,entry,(uint)((ulong)data.field_0 >> 3) & 0x1fffffff,pPVar10,msg);
  }
  else if (uVar16 == 0x10) {
    pbVar3 = (byte *)((long)&msg->_vptr_MessageLite + ((long)entry->has_idx >> 3));
    *pbVar3 = *pbVar3 | '\x01' << (entry->has_idx & 7U);
  }
  if (uVar12 == 0xc0) {
    puVar13 = (ulong *)((long)&msg->_vptr_MessageLite + (ulong)entry->offset);
    if (((ulong)puVar13 & 7) != 0) {
      AlignFail();
    }
    *puVar13 = uVar15;
  }
  else if (uVar12 == 0x80) {
    puVar14 = (undefined4 *)((long)&msg->_vptr_MessageLite + (ulong)entry->offset);
    if (((ulong)puVar14 & 3) != 0) {
      AlignFail();
    }
    *puVar14 = (int)uVar15;
  }
  else {
    if ((uVar2 & 0x1c0) == 0) {
      psVar7 = (string *)0x0;
    }
    else {
      psVar7 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                         ((ulong)uVar12,0,"rep == static_cast<uint16_t>(field_layout::kRep8Bits)");
    }
    if (psVar7 != (string *)0x0) {
      absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                (local_40,
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_lite.cc"
                 ,0x76d,*(undefined8 *)(psVar7 + 8),*(undefined8 *)psVar7);
      absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_40);
    }
    *(bool *)((long)&msg->_vptr_MessageLite + (ulong)entry->offset) = uVar15 != 0;
  }
  if ((ctx->super_EpsCopyInputStream).limit_end_ <= puVar11) {
    if ((ulong)table->has_bits_offset != 0) {
      puVar17 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
      if (((ulong)puVar17 & 3) != 0) {
        AlignFail(puVar17);
      }
      *puVar17 = *puVar17 | (uint)hasbits;
    }
    return (char *)puVar11;
  }
  uVar16 = (uint)table->fast_idx_mask & (uint)*puVar11;
  if ((uVar16 & 7) != 0) {
    protobuf_assumption_failed
              ("(idx & 7) == 0",
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_impl.h"
               ,0x44d);
  }
  uVar15 = (ulong)(uVar16 & 0xfffffff8);
  data.field_0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                 ((ulong)*puVar11 ^ *(ulong *)(&table[1].fast_idx_mask + uVar15 * 2));
  UNRECOVERED_JUMPTABLE = *(TailCallParseFunc *)(&table[1].has_bits_offset + uVar15);
LAB_001582ad:
  pcVar6 = (*UNRECOVERED_JUMPTABLE)(msg,(char *)puVar11,ctx,data,table,hasbits);
  return pcVar6;
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::MpVarint(PROTOBUF_TC_PARAM_DECL) {
  const auto& entry = RefAt<FieldEntry>(table, data.entry_offset());
  const uint16_t type_card = entry.type_card;
  const uint16_t card = type_card & field_layout::kFcMask;

  // Check for repeated parsing:
  if (card == field_layout::kFcRepeated) {
    PROTOBUF_MUSTTAIL return MpRepeatedVarint<is_split>(PROTOBUF_TC_PARAM_PASS);
  }
  // Check for wire type mismatch:
  if ((data.tag() & 7) != WireFormatLite::WIRETYPE_VARINT) {
    PROTOBUF_MUSTTAIL return table->fallback(PROTOBUF_TC_PARAM_PASS);
  }
  const uint16_t xform_val = type_card & field_layout::kTvMask;
  const bool is_zigzag = xform_val == field_layout::kTvZigZag;
  const bool is_validated_enum = xform_val & field_layout::kTvEnum;

  // Parse the value:
  const char* ptr2 = ptr;  // save for unknown enum case
  uint64_t tmp;
  ptr = ParseVarint(ptr, &tmp);
  if (ptr == nullptr) {
    PROTOBUF_MUSTTAIL return Error(PROTOBUF_TC_PARAM_NO_DATA_PASS);
  }

  // Transform and/or validate the value
  uint16_t rep = type_card & field_layout::kRepMask;
  if (rep == field_layout::kRep64Bits) {
    if (is_zigzag) {
      tmp = WireFormatLite::ZigZagDecode64(tmp);
    }
  } else if (rep == field_layout::kRep32Bits) {
    if (is_validated_enum) {
      if (!EnumIsValidAux(tmp, xform_val, *table->field_aux(&entry))) {
        ptr = ptr2;
        PROTOBUF_MUSTTAIL return MpUnknownEnumFallback(PROTOBUF_TC_PARAM_PASS);
      }
    } else if (is_zigzag) {
      tmp = WireFormatLite::ZigZagDecode32(static_cast<uint32_t>(tmp));
    }
  }

  // Mark the field as present:
  const bool is_oneof = card == field_layout::kFcOneof;
  if (card == field_layout::kFcOptional) {
    SetHas(entry, msg);
  } else if (is_oneof) {
    ChangeOneof(table, entry, data.tag() >> 3, ctx, msg);
  }

  void* const base = MaybeGetSplitBase(msg, is_split, table);
  if (rep == field_layout::kRep64Bits) {
    RefAt<uint64_t>(base, entry.offset) = tmp;
  } else if (rep == field_layout::kRep32Bits) {
    RefAt<uint32_t>(base, entry.offset) = static_cast<uint32_t>(tmp);
  } else {
    ABSL_DCHECK_EQ(rep, static_cast<uint16_t>(field_layout::kRep8Bits));
    RefAt<bool>(base, entry.offset) = static_cast<bool>(tmp);
  }

  PROTOBUF_MUSTTAIL return ToTagDispatch(PROTOBUF_TC_PARAM_NO_DATA_PASS);
}